

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# call_once.h
# Opt level: O1

void absl::base_internal::CallOnceImpl<absl::base_internal::NominalCPUFrequency()::__0>
               (atomic<unsigned_int> *control,SchedulingMode scheduling_mode,
               anon_class_1_0_00000001 *fn)

{
  __int_type_conflict2 _Var1;
  double dVar2;
  double dVar3;
  uint32_t uVar4;
  int iVar5;
  int iVar6;
  ssize_t sVar7;
  long lVar8;
  int *piVar9;
  int iVar10;
  bool bVar11;
  TimeTscPair TVar12;
  TimeTscPair TVar13;
  char line [1024];
  undefined8 local_458;
  char *local_440;
  timespec local_438 [64];
  
  _Var1 = (control->super___atomic_base<unsigned_int>)._M_i;
  if ((int)_Var1 < 0x5a308d2) {
    if ((_Var1 == 0) || (_Var1 == 0xdd)) goto LAB_00151d72;
  }
  else if ((_Var1 == 0x5a308d2) || (_Var1 == 0x65c2937b)) goto LAB_00151d72;
  raw_logging_internal::RawLog(kFatal,"call_once.h",0x9e,"Unexpected value for control word: 0x%lx")
  ;
LAB_00151d72:
  LOCK();
  bVar11 = (control->super___atomic_base<unsigned_int>)._M_i == 0;
  if (bVar11) {
    (control->super___atomic_base<unsigned_int>)._M_i = 0x65c2937b;
  }
  UNLOCK();
  if ((bVar11) ||
     (uVar4 = SpinLockWait(control,3,
                           CallOnceImpl<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/MW55[P]DNA-Aeon/abseil-cpp/absl/base/internal/sysinfo.cc:362:7)>
                           ::trans,SCHEDULE_KERNEL_ONLY), uVar4 == 0)) {
    bVar11 = false;
    iVar5 = open("/sys/devices/system/cpu/cpu0/tsc_freq_khz",0);
    if (iVar5 == -1) {
      local_458._0_4_ = 0;
      local_458._4_4_ = 0;
    }
    else {
      bVar11 = false;
      memset(local_438,0,0x400);
      sVar7 = read(iVar5,local_438,0x3ff);
      local_458 = 0.0;
      if (0 < (int)sVar7) {
        lVar8 = strtol((char *)local_438,&local_440,10);
        if (((char)local_438[0].tv_sec == '\0') || ((*local_440 != '\n' && (*local_440 != '\0')))) {
          bVar11 = false;
        }
        else {
          local_458 = (double)lVar8 * 1000.0;
          bVar11 = true;
        }
      }
      close(iVar5);
    }
    dVar2 = (double)CONCAT44(local_458._4_4_,(undefined4)local_458);
    if (!bVar11) {
      iVar5 = 1000000;
      iVar10 = 0;
      dVar3 = -1.0;
      do {
        TVar12 = GetTimeTscPair();
        local_438[0].tv_sec = 0;
        local_438[0].tv_nsec = (long)iVar5;
        do {
          iVar6 = nanosleep(local_438,local_438);
          if (iVar6 == 0) break;
          piVar9 = __errno_location();
        } while (*piVar9 == 4);
        TVar13 = GetTimeTscPair();
        dVar2 = (double)(TVar13.tsc - TVar12.tsc) / ((double)(TVar13.time - TVar12.time) * 1e-09);
        if (dVar3 < dVar2 * 1.01 && dVar2 * 0.99 < dVar3) break;
        iVar10 = iVar10 + 1;
        iVar5 = iVar5 * 2;
        dVar3 = dVar2;
      } while (iVar10 != 8);
    }
    LOCK();
    _Var1 = (control->super___atomic_base<unsigned_int>)._M_i;
    nominal_cpu_frequency = dVar2;
    (control->super___atomic_base<unsigned_int>)._M_i = 0xdd;
    UNLOCK();
    if (_Var1 == 0x5a308d2) {
      AbslInternalSpinLockWake(control,true);
    }
  }
  return;
}

Assistant:

ABSL_ATTRIBUTE_NOINLINE
void CallOnceImpl(std::atomic<uint32_t>* control,
                  base_internal::SchedulingMode scheduling_mode, Callable&& fn,
                  Args&&... args) {
#ifndef NDEBUG
  {
    uint32_t old_control = control->load(std::memory_order_relaxed);
    if (old_control != kOnceInit &&
        old_control != kOnceRunning &&
        old_control != kOnceWaiter &&
        old_control != kOnceDone) {
      ABSL_RAW_LOG(FATAL, "Unexpected value for control word: 0x%lx",
                   static_cast<unsigned long>(old_control));  // NOLINT
    }
  }
#endif  // NDEBUG
  static const base_internal::SpinLockWaitTransition trans[] = {
      {kOnceInit, kOnceRunning, true},
      {kOnceRunning, kOnceWaiter, false},
      {kOnceDone, kOnceDone, true}};

  // Must do this before potentially modifying control word's state.
  base_internal::SchedulingHelper maybe_disable_scheduling(scheduling_mode);
  // Short circuit the simplest case to avoid procedure call overhead.
  // The base_internal::SpinLockWait() call returns either kOnceInit or
  // kOnceDone. If it returns kOnceDone, it must have loaded the control word
  // with std::memory_order_acquire and seen a value of kOnceDone.
  uint32_t old_control = kOnceInit;
  if (control->compare_exchange_strong(old_control, kOnceRunning,
                                       std::memory_order_relaxed) ||
      base_internal::SpinLockWait(control, ABSL_ARRAYSIZE(trans), trans,
                                  scheduling_mode) == kOnceInit) {
    base_internal::invoke(std::forward<Callable>(fn),
                          std::forward<Args>(args)...);
    old_control =
        control->exchange(base_internal::kOnceDone, std::memory_order_release);
    if (old_control == base_internal::kOnceWaiter) {
      base_internal::SpinLockWake(control, true);
    }
  }  // else *control is already kOnceDone
}